

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_HILO1_tx79(DisasContext_conflict6 *ctx,uint32_t opc,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  
  if ((opc & 0xfffffffd) == 0x70000010 && reg == 0) {
    return;
  }
  if (3 < opc + 0x8ffffff0) {
    generate_exception_err(ctx,0x14,0);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  switch(opc) {
  case 0x70000010:
    pTVar1 = tcg_ctx->cpu_gpr[(uint)reg];
    pTVar2 = tcg_ctx->cpu_HI[1];
    break;
  case 0x70000011:
    pTVar1 = tcg_ctx->cpu_HI[1];
    goto LAB_009b8ebe;
  case 0x70000012:
    pTVar1 = tcg_ctx->cpu_gpr[(uint)reg];
    pTVar2 = tcg_ctx->cpu_LO[1];
    break;
  case 0x70000013:
    pTVar1 = tcg_ctx->cpu_LO[1];
LAB_009b8ebe:
    if (reg == 0) {
      tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),0);
      return;
    }
    if (pTVar1 == tcg_ctx->cpu_gpr[(uint)reg]) {
      return;
    }
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
               (TCGArg)(tcg_ctx->cpu_gpr[(uint)reg] + (long)tcg_ctx));
    return;
  }
  if (pTVar1 == pTVar2) {
    return;
  }
  tcg_gen_op2_mips64el
            (tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
             (TCGArg)(pTVar2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_HILO1_tx79(DisasContext *ctx, uint32_t opc, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (reg == 0 && (opc == MMI_OPC_MFHI1 || opc == MMI_OPC_MFLO1)) {
        /* Treat as NOP. */
        return;
    }

    switch (opc) {
    case MMI_OPC_MFHI1:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[1]);
        break;
    case MMI_OPC_MFLO1:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[1]);
        break;
    case MMI_OPC_MTHI1:
        if (reg != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_HI[1], tcg_ctx->cpu_gpr[reg]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_HI[1], 0);
        }
        break;
    case MMI_OPC_MTLO1:
        if (reg != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_LO[1], tcg_ctx->cpu_gpr[reg]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_LO[1], 0);
        }
        break;
    default:
        MIPS_INVAL("mfthilo1 TX79");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}